

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O3

void word_restore(t_word *wp,t_template *template,int argc,t_atom *argv)

{
  int iVar1;
  t_symbol *ptVar2;
  long lVar3;
  t_dataslot *ptVar4;
  t_float tVar5;
  
  iVar1 = template->t_n;
  if (0 < iVar1) {
    ptVar4 = template->t_vec;
    lVar3 = 0;
    do {
      if (ptVar4->ds_type == 1) {
        if (argc == 0) {
          argc = 0;
          ptVar2 = &s_;
        }
        else {
          ptVar2 = atom_getsymbol(argv);
          argv = argv + 1;
          argc = argc + -1;
        }
        wp[lVar3].w_symbol = ptVar2;
      }
      else if (ptVar4->ds_type == 0) {
        if (argc == 0) {
          tVar5 = 0.0;
          argc = 0;
        }
        else {
          tVar5 = atom_getfloat(argv);
          argv = argv + 1;
          argc = argc + -1;
        }
        wp[lVar3].w_float = tVar5;
      }
      ptVar4 = ptVar4 + 1;
      lVar3 = lVar3 + 1;
    } while (iVar1 != (int)lVar3);
  }
  if (argc != 0) {
    post("warning: word_restore: extra arguments");
    return;
  }
  return;
}

Assistant:

void word_restore(t_word *wp, t_template *template,
    int argc, t_atom *argv)
{
    int i, nitems = template->t_n;
    t_dataslot *datatypes = template->t_vec;
    for (i = 0; i < nitems; i++, datatypes++, wp++)
    {
        int type = datatypes->ds_type;
        if (type == DT_FLOAT)
        {
            t_float f;
            if (argc)
            {
                f =  atom_getfloat(argv);
                argv++, argc--;
            }
            else f = 0;
            wp->w_float = f;
        }
        else if (type == DT_SYMBOL)
        {
            t_symbol *s;
            if (argc)
            {
                s =  atom_getsymbol(argv);
                argv++, argc--;
            }
            else s = &s_;
            wp->w_symbol = s;
        }
    }
    if (argc)
        post("warning: word_restore: extra arguments");
}